

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

void Aig_ManPartDivide(Vec_Ptr_t *vResult,Vec_Int_t *vDomain,int nPartSize,int nOverSize)

{
  int Entry;
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  
  if ((nPartSize == 0) || (vDomain->nSize <= nPartSize)) {
    __assert_fail("nPartSize && Vec_IntSize(vDomain) > nPartSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                  ,0x205,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
  }
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,(ulong)(uint)nPartSize);
    puts("Adjusting it to be equal to half of the partition size.");
    nOverSize = nPartSize / 2;
  }
  if (nOverSize < nPartSize) {
    iVar3 = 0;
    iVar1 = 0;
    if (0 < nPartSize) {
      iVar1 = nPartSize;
    }
    for (; iVar3 < vDomain->nSize; iVar3 = (iVar3 - nOverSize) - iVar2) {
      p = Vec_IntAlloc(nPartSize);
      i = iVar3;
      for (iVar2 = 0; -iVar1 != iVar2; iVar2 = iVar2 + -1) {
        if (i < vDomain->nSize) {
          Entry = Vec_IntEntry(vDomain,i);
          Vec_IntPush(p,Entry);
        }
        i = i + 1;
      }
      if (nOverSize < p->nSize) {
        Vec_PtrPush(vResult,p);
      }
      else {
        Vec_IntFree(p);
      }
    }
    return;
  }
  __assert_fail("nOverSize < nPartSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                ,0x20c,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
}

Assistant:

void Aig_ManPartDivide( Vec_Ptr_t * vResult, Vec_Int_t * vDomain, int nPartSize, int nOverSize )
{
    Vec_Int_t * vPart;
    int i, Counter;
    assert( nPartSize && Vec_IntSize(vDomain) > nPartSize );
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    for ( Counter = 0; Counter < Vec_IntSize(vDomain); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Vec_IntSize(vDomain) )
                Vec_IntPush( vPart, Vec_IntEntry(vDomain, Counter) );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
}